

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_get_team_num(void)

{
  int iVar1;
  kmp_info_t *pkVar2;
  bool bVar3;
  int iVar4;
  kmp_team_p *pkVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar4 = __kmp_get_global_thread_id_reg();
  pkVar2 = __kmp_threads[iVar4];
  iVar4 = 0;
  if ((pkVar2->th).th_teams_microtask != (microtask_t)0x0) {
    pkVar5 = (pkVar2->th).th_team;
    iVar4 = (pkVar5->t).t_level;
    iVar6 = (pkVar2->th).th_teams_level + 1;
    if (iVar6 < iVar4) {
      do {
        iVar1 = (pkVar5->t).t_serialized;
        iVar7 = iVar1;
        if (iVar1 < 1) {
          bVar3 = true;
          iVar8 = iVar1;
        }
        else {
          do {
            iVar8 = iVar7 + -1;
            iVar4 = iVar4 + -1;
            bVar3 = iVar6 < iVar4;
            if (iVar7 < 2) break;
            iVar7 = iVar8;
          } while (iVar6 < iVar4);
        }
        if (iVar8 == 0 && iVar1 != 0) {
          pkVar5 = (pkVar5->t).t_parent;
          iVar8 = 0;
        }
        else if (bVar3) {
          pkVar5 = (pkVar5->t).t_parent;
          iVar4 = iVar4 + -1;
        }
      } while (iVar6 < iVar4);
    }
    else {
      iVar8 = (pkVar5->t).t_serialized;
    }
    iVar4 = 0;
    if (iVar8 < 2) {
      iVar4 = (pkVar5->t).t_master_tid;
    }
  }
  return iVar4;
}

Assistant:

int FTN_STDCALL
xexpand(FTN_GET_TEAM_NUM)( void )
{
    #ifdef KMP_STUB
        return 0;
    #else
        kmp_info_t *thr = __kmp_entry_thread();
        if ( thr->th.th_teams_microtask ) {
            kmp_team_t *team = thr->th.th_team;
            int tlevel = thr->th.th_teams_level; // the level of the teams construct
            int ii = team->t.t_level;
            int dd = team -> t.t_serialized;
            int level = tlevel + 1;
            KMP_DEBUG_ASSERT( ii >= tlevel );
            while( ii > level )
            {
                for( dd = team -> t.t_serialized; ( dd > 0 ) && ( ii > level ); dd--, ii-- )
                {
                }
                if( team -> t.t_serialized && ( !dd ) ) {
                    team = team->t.t_parent;
                    continue;
                }
                if( ii > level ) {
                    team = team->t.t_parent;
                    ii--;
                }
            }
            if ( dd > 1 ) {
                return 0;  // teams region is serialized ( 1 team of 1 thread ).
            } else {
                return team->t.t_master_tid;
            }
        } else {
            return 0;
        }
    #endif
}